

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_string.c
# Opt level: O2

void d_string_prepend(DString *baseString,char *prependedString)

{
  size_t __n;
  size_t newStringSize;
  
  if ((prependedString != (char *)0x0 && baseString != (DString *)0x0) &&
     (__n = strlen(prependedString), __n != 0)) {
    newStringSize = baseString->currentStringLength + __n;
    ensureStringBufferCanHold(baseString,newStringSize);
    memmove(baseString->str + __n,baseString->str,baseString->currentStringLength);
    strncpy(baseString->str,prependedString,__n);
    baseString->currentStringLength = newStringSize;
    baseString->str[newStringSize] = '\0';
  }
  return;
}

Assistant:

void d_string_prepend(DString * baseString, const char * prependedString) {
	if (baseString && prependedString) {
		size_t prependedStringLength = strlen(prependedString);

		if (prependedStringLength > 0) {
			size_t newStringLength = baseString->currentStringLength + prependedStringLength;
			ensureStringBufferCanHold(baseString, newStringLength);

			memmove(baseString->str + prependedStringLength, baseString->str, baseString->currentStringLength);
			strncpy(baseString->str, prependedString, prependedStringLength);
			baseString->currentStringLength = newStringLength;
			baseString->str[baseString->currentStringLength] = '\0';
		}
	}
}